

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O1

void __thiscall
F2DDrawer::AddLine(F2DDrawer *this,int x1,int y1,int x2,int y2,int palcolor,uint32 color)

{
  uchar *puVar1;
  int *piVar2;
  uint uVar3;
  FSimpleVertex *pFVar4;
  uchar *puVar5;
  uint uVar6;
  
  if (color == 0) {
    color = GPalette.BaseColors[palcolor].field_0.d;
  }
  TArray<FSimpleVertex,_FSimpleVertex>::Grow(&this->mVertices,2);
  uVar3 = (this->mVertices).Count;
  (this->mVertices).Count = uVar3 + 2;
  pFVar4 = (this->mVertices).Array;
  uVar6 = color >> 0x10 & 0xff | color & 0xff00 | color << 0x10 | 0xff000000;
  pFVar4[(int)uVar3].x = (float)x1;
  pFVar4[(int)uVar3].z = (float)y1;
  pFVar4[(int)uVar3].y = 0.0;
  pFVar4[(int)uVar3].u = 0.0;
  pFVar4[(int)uVar3].v = 0.0;
  pFVar4[(int)uVar3].color.field_0.d = uVar6;
  pFVar4 = (this->mVertices).Array;
  pFVar4[(long)(int)uVar3 + 1].x = (float)x2;
  pFVar4[(long)(int)uVar3 + 1].z = (float)y2;
  pFVar4[(long)(int)uVar3 + 1].y = 0.0;
  pFVar4[(long)(int)uVar3 + 1].u = 0.0;
  pFVar4[(long)(int)uVar3 + 1].v = 0.0;
  pFVar4[(long)(int)uVar3 + 1].color.field_0.d = uVar6;
  if ((long)this->mLastLineCmd == -1) {
    TArray<unsigned_char,_unsigned_char>::Grow(&this->mData,0x10);
    uVar6 = (this->mData).Count;
    (this->mData).Count = uVar6 + 0x10;
    puVar5 = (this->mData).Array;
    puVar1 = puVar5 + (int)uVar6;
    puVar1[0] = '\x04';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\x10';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    *(uint *)(puVar5 + (long)(int)uVar6 + 8) = uVar3;
    puVar5 = puVar5 + (long)(int)uVar6 + 0xc;
    puVar5[0] = '\x02';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    this->mLastLineCmd = uVar6;
  }
  else {
    piVar2 = (int *)((this->mData).Array + (long)this->mLastLineCmd + 0xc);
    *piVar2 = *piVar2 + 2;
  }
  return;
}

Assistant:

void F2DDrawer::AddLine(int x1, int y1, int x2, int y2, int palcolor, uint32 color)
{
	PalEntry p = color ? (PalEntry)color : GPalette.BaseColors[palcolor];
	p.a = 255;
	std::swap(p.r, p.b);

	DataGeneric dg;

	dg.mType = DrawTypeLine;
	dg.mLen = (sizeof(dg) + 7) & ~7;
	dg.mVertCount = 2;
	dg.mVertIndex = (int)mVertices.Reserve(2);
	mVertices[dg.mVertIndex].Set(x1, y1, 0, 0, 0, p);
	mVertices[dg.mVertIndex+1].Set(x2, y2, 0, 0, 0, p);

	// Test if we can batch multiple line commands
	if (mLastLineCmd == -1)
	{
		mLastLineCmd = AddData(&dg);
	}
	else
	{
		DataGeneric *dg = (DataGeneric *)&mData[mLastLineCmd];
		dg->mVertCount += 2;
	}
}